

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void testConversion(string *tempDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar1;
  ostream *this;
  exception *e;
  int comp;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  string *in_stack_fffffffffffffe90;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  int local_18;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"Testing conversion between pixel data types");
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"individual numbers");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_78cc3::testNumbers();
  this = std::operator<<((ostream *)&std::cout,"conversion of image channels while reading a file ")
  ;
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    if ((local_18 != 6) && (local_18 != 7)) {
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<unsigned_int,(Imf_3_2::PixelType)0,unsigned_int,(Imf_3_2::PixelType)0>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_38);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<unsigned_int,(Imf_3_2::PixelType)0,Imath_3_2::half,(Imf_3_2::PixelType)1>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_58);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<unsigned_int,(Imf_3_2::PixelType)0,float,(Imf_3_2::PixelType)2>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_78);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<Imath_3_2::half,(Imf_3_2::PixelType)1,unsigned_int,(Imf_3_2::PixelType)0>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_98);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<Imath_3_2::half,(Imf_3_2::PixelType)1,Imath_3_2::half,(Imf_3_2::PixelType)1>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_b8);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<Imath_3_2::half,(Imf_3_2::PixelType)1,float,(Imf_3_2::PixelType)2>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_d8);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<float,(Imf_3_2::PixelType)2,unsigned_int,(Imf_3_2::PixelType)0>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_f8);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<float,(Imf_3_2::PixelType)2,Imath_3_2::half,(Imf_3_2::PixelType)1>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_118);
      std::operator+(__lhs,(char *)poVar1);
      (anonymous_namespace)::
      testImageChannel<float,(Imf_3_2::PixelType)2,float,(Imf_3_2::PixelType)2>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 NO_COMPRESSION);
      std::__cxx11::string::~string(local_138);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testConversion (const std::string& tempDir)
{
    try
    {
        cout << "Testing conversion between pixel data types" << endl;

        cout << "individual numbers" << endl;

        testNumbers ();

        cout << "conversion of image channels while reading a file " << endl;

        for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
        {
            if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION)
            {
                continue;
            }

            testImageChannel<unsigned int, IMF::UINT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));
        }
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}